

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planck_unit.c
# Opt level: O2

void planck_unit_run_suite(planck_unit_suite_t *suite)

{
  int iVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  planck_unit_test_t *ppVar4;
  unsigned_long end_time;
  unsigned_long start_time;
  
  suite->total_time = 0;
  ppVar4 = suite->head;
  (*(suite->print_functions).print_preamble)(suite);
  for (; ppVar4 != (planck_unit_test_t *)0x0; ppVar4 = ppVar4->next) {
    uVar2 = ion_time();
    iVar1 = _setjmp((__jmp_buf_tag *)planck_unit_longjmp_env);
    if (iVar1 == 0) {
      (*ppVar4->test_func)(ppVar4);
    }
    uVar3 = ion_time();
    suite->total_tests = suite->total_tests + 1;
    if (ppVar4->result == '\x01') {
      suite->total_passed = suite->total_passed + 1;
    }
    ppVar4->time = uVar3 - uVar2;
    suite->total_time = suite->total_time + (uVar3 - uVar2);
    (*(suite->print_functions).print_result)(ppVar4);
    if ((ppVar4->result == '\0') && (ppVar4->allocated_message == '\x01')) {
      free(ppVar4->message);
    }
  }
  (*(suite->print_functions).print_postamble)(suite);
  putchar(10);
  fflush(_stdout);
  return;
}

Assistant:

void
planck_unit_run_suite(
	planck_unit_suite_t *suite
) {
	planck_unit_test_t		*state;
	volatile unsigned long	start_time, end_time;

	suite->total_time = 0;

	state = suite->head;

	suite->print_functions.print_preamble(suite);

	while (NULL != state) {
		start_time = ion_time();

		if (0 == setjmp(planck_unit_longjmp_env)) {
			state->test_func(state);
		}

		end_time = ion_time();
		suite->total_tests++;

		if (PLANCK_UNIT_SUCCESS == state->result) {
			suite->total_passed++;
		}

		state->time = end_time - start_time;
		suite->total_time = suite->total_time + state->time;
		suite->print_functions.print_result(state);

		if ((PLANCK_UNIT_FAILURE == state->result) && (1 == state->allocated_message)) {
			free(state->message);
		}

		state = state->next;
	}

	suite->print_functions.print_postamble(suite);
	PLANCK_UNIT_PRINT_NEWLINE;
}